

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvnc.cpp
# Opt level: O0

ssize_t __thiscall QRfbServerInit::write(QRfbServerInit *this,int __fd,void *__buf,size_t __n)

{
  char *__s;
  size_t sVar1;
  void *__buf_00;
  undefined4 in_register_00000034;
  char *pcVar2;
  long in_FS_OFFSET;
  quint32 len;
  quint16 t;
  uint32_t local_10;
  uint16_t local_a;
  long local_8;
  
  pcVar2 = (char *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_a = htons(this->width);
  QIODevice::write(pcVar2,(longlong)&local_a);
  local_a = htons(this->height);
  QIODevice::write(pcVar2,(longlong)&local_a);
  QRfbPixelFormat::write(&this->format,__fd,__buf_00,__n);
  sVar1 = strlen(this->name);
  local_10 = (uint32_t)sVar1;
  local_10 = htonl(local_10);
  QIODevice::write(pcVar2,(longlong)&local_10);
  __s = this->name;
  strlen(__s);
  QIODevice::write(pcVar2,(longlong)__s);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QRfbServerInit::write(QTcpSocket *s)
{
    quint16 t = htons(width);
    s->write(reinterpret_cast<char *>(&t), 2);
    t = htons(height);
    s->write(reinterpret_cast<char *>(&t), 2);
    format.write(s);
    quint32 len = static_cast<quint32>(strlen(name));
    len = htonl(len);
    s->write(reinterpret_cast<char *>(&len), 4);
    s->write(name, static_cast<qint64>(strlen(name)));
}